

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_keeper.h
# Opt level: O3

void __thiscall
mp::
ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>
::AddAllUnbridged(ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>
                  *this,BasicFlatModelAPI *be,ItemNamer *vnam)

{
  uint uVar1;
  _Map_pointer ppCVar2;
  _Map_pointer ppCVar3;
  _Elt_pointer pCVar4;
  FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *pFVar5;
  LinkEntry be_00;
  bool add2final;
  ValueNode *pVVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  Container *cnt;
  
  iVar10 = this->i_2add_next_;
  do {
    ppCVar2 = (this->cons_).
              super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>::Container>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node;
    ppCVar3 = (this->cons_).
              super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>::Container>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node;
    pCVar4 = (this->cons_).
             super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>::Container>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    if ((int)((int)((ulong)((long)(this->cons_).
                                  super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>::Container>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_last - (long)pCVar4)
                   >> 3) * -0x1642c859 +
             (int)((ulong)((long)(this->cons_).
                                 super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>::Container>_>
                                 ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                          (long)(this->cons_).
                                super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>::Container>_>
                                ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) *
             -0x1642c859 +
             ((int)((ulong)((long)ppCVar2 - (long)ppCVar3) >> 3) + -1 +
             (uint)(ppCVar2 == (_Map_pointer)0x0)) * 2) <= iVar10) {
      return;
    }
    uVar8 = ((long)pCVar4 -
             (long)(this->cons_).
                   super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>::Container>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_first >> 3) * -0x2c8590b21642c859 +
            (long)iVar10;
    if ((long)uVar8 < 0) {
      uVar9 = (long)uVar8 >> 1;
LAB_0030b233:
      cnt = ppCVar3[uVar9] + uVar8 + uVar9 * -2;
    }
    else {
      if (1 < uVar8) {
        uVar9 = uVar8 >> 1;
        goto LAB_0030b233;
      }
      cnt = pCVar4 + iVar10;
    }
    if ((cnt->is_bridged_ == '\0') && (cnt->is_unused_ == '\0')) {
      BasicFlatModelAPI::AddConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRange>>
                (be,(AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange> *)cnt);
      iVar7 = this->i_2add_next_;
      uVar1 = (uint)(this->super_BasicConstraintKeeper).value_node_.sz_;
      uVar11 = iVar7 >> 0x1f & uVar1;
      iVar10 = uVar11 + iVar7;
      iVar7 = iVar7 + uVar11 + 1;
      if ((int)uVar1 <= iVar10) {
        (this->super_BasicConstraintKeeper).value_node_.sz_ = (long)iVar7;
      }
      pFVar5 = this->cvt_;
      be_00.first.ir_.end_ = iVar7;
      be_00.first.ir_.beg_ = iVar10;
      pVVar6 = pre::ValueMap<mp::pre::ValueNode,_mp::pre::BasicValuePresolver_&>::operator()
                         (&(pFVar5->
                           super_FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                           ).value_presolver_.super_ValuePresolverImpl.dest_.cons_,0);
      uVar8 = pVVar6->sz_;
      pVVar6->sz_ = uVar8 + 1;
      be_00.first.pvn_ = &(this->super_BasicConstraintKeeper).value_node_;
      be_00.second.pvn_ = pVVar6;
      be_00.second.ir_ = (NodeIndexRange)((uVar8 & 0xffffffff | uVar8 << 0x20) + 0x100000000);
      pre::CopyLink::AddEntry
                (&(pFVar5->
                  super_FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                  ).copy_link_,be_00);
      iVar10 = this->i_2add_next_;
      add2final = true;
    }
    else {
      add2final = false;
    }
    ExportConStatus(this,iVar10,cnt,vnam,add2final);
    iVar10 = this->i_2add_next_ + 1;
    this->i_2add_next_ = iVar10;
  } while( true );
}

Assistant:

void AddAllUnbridged(BasicFlatModelAPI& be,
                       ItemNamer& vnam) {
    auto con_group = GetConstraintGroup(be);
		for ( ; i_2add_next_ < (int)cons_.size(); ++i_2add_next_) {
      const auto& cont = cons_[i_2add_next_];
      bool adding = !cont.IsRedundant();            // includes 'unused'
      if (adding) {
        static_cast<Backend&>(be).AddConstraint(cont.GetCon());
        GetConverter().GetCopyLink().             // Linking to the "final" nodes
            AddEntry({
                       GetValueNode().Select(i_2add_next_),
                       GetConverter().GetValuePresolver().GetTargetNodes().
                         GetConValues()(con_group).Add()
                     });
      }
      ExportConStatus(i_2add_next_, cont, vnam, adding);
    }
  }